

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

void __thiscall
icu_63::PluralFormat::setNumberFormat(PluralFormat *this,NumberFormat *format,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  NumberFormat *nf;
  UErrorCode *status_local;
  NumberFormat *format_local;
  PluralFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    iVar2 = (*(format->super_Format).super_UObject._vptr_UObject[4])();
    if ((NumberFormat *)CONCAT44(extraout_var,iVar2) == (NumberFormat *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      if (this->numberFormat != (NumberFormat *)0x0) {
        (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[1])();
      }
      this->numberFormat = (NumberFormat *)CONCAT44(extraout_var,iVar2);
    }
  }
  return;
}

Assistant:

void
PluralFormat::setNumberFormat(const NumberFormat* format, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    NumberFormat* nf = (NumberFormat*)format->clone();
    if (nf != NULL) {
        delete numberFormat;
        numberFormat = nf;
    } else {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
}